

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignorelist;
  lddgraph lddg;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_140 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  undefined1 local_f8 [72];
  string local_b0 [32];
  bool local_90;
  string local_88 [32];
  bool local_68;
  bool local_67;
  bool local_66;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  program_name = *argv;
  if (1 < argc) {
    lddgraph::lddgraph((lddgraph *)local_f8);
LAB_00103558:
    while (iVar2 = getopt_long(argc,argv,"b:vhi:I:e:f:g:tqV",longopts,0), iVar2 < 0x65) {
      if (iVar2 == 0x49) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140,&local_48);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,_optarg,&local_161);
        trim(&local_160);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_140,&local_160);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_128,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140);
        __x = &local_128;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_48,__x);
LAB_0010372c:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(__x);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_140);
      }
      else {
        if (iVar2 != 0x56) {
          if (iVar2 != -1) {
switchD_0010358c_caseD_6a:
            abort();
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,argv[(ulong)(uint)argc - 1],local_140);
          lddgraph::setinput((lddgraph *)local_f8,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          bVar1 = lddgraph::run((lddgraph *)local_f8);
          if (!bVar1) {
            exit(1);
          }
          goto LAB_00103531;
        }
        local_66 = true;
      }
    }
    switch(iVar2) {
    case 0x65:
      local_f8[0x20] = true;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,_optarg,local_140);
      std::__cxx11::string::_M_assign((string *)(local_f8 + 0x28));
      break;
    case 0x66:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,_optarg,local_140);
      std::__cxx11::string::_M_assign(local_b0);
      break;
    case 0x67:
      local_90 = true;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,_optarg,local_140);
      std::__cxx11::string::_M_assign(local_88);
      break;
    case 0x68:
      goto switchD_0010358c_caseD_68;
    case 0x69:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_140,&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,_optarg,&local_161);
      trim(&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_140,&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_110,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_140);
      __x = &local_110;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_60,__x);
      goto LAB_0010372c;
    default:
      goto switchD_0010358c_caseD_6a;
    case 0x71:
      local_67 = true;
      goto LAB_00103558;
    case 0x74:
      goto switchD_0010358c_caseD_74;
    case 0x76:
      printversion();
      goto LAB_00103531;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00103558;
  }
  printhelp();
LAB_00103531:
  exit(0);
switchD_0010358c_caseD_74:
  local_68 = false;
  goto LAB_00103558;
switchD_0010358c_caseD_68:
  printhelp();
  goto LAB_00103531;
}

Assistant:

int main(int argc, char* argv[])
{
  program_name = argv[0];

  /* Prints output when no arguments where specified */
  if (argc < 2)
  {
    printhelp();
    exit(EXIT_SUCCESS);
  }

  lddgraph lddg;

  int optc;
  while ((optc = getopt_long (argc, argv, "b:vhi:I:e:f:g:tqV", longopts, NULL)) != -1)
  {
    switch (optc)
    {
      case 'v':
      {
        printversion();
        exit(EXIT_SUCCESS);
      } break;
      case 'h':
      {
        printhelp();
        exit(EXIT_SUCCESS);
      } break;
      case 'i':
      {
        vector<string> ignorelist = lddg.getignorelist();
        string val = optarg;
        ignorelist.push_back(trim(val));
        lddg.setignorelist(ignorelist);
      } break;
      case 'I':
      {
        vector<string> ignorepatterns = lddg.getignorepatterns();
        string val = optarg;
        ignorepatterns.push_back(trim(val));
        lddg.setignorepatterns(ignorepatterns);
      } break;
      case 'e':
      {
        lddg.setimgmode(true);
        lddg.setimgoutput(optarg);
      } break;
      case 'f':
      {
        lddg.setimgformat(optarg);
      } break;
      case 'g':
      {
        lddg.setgvmode(true);
        lddg.setgvoutput(optarg);
      } break;
      case 't':
      {
        lddg.setuseldd(false);
      } break;
      case 'q':
      {
        lddg.setquiet(true);
      } break;
      case 'V':
      {
        lddg.setverbose(true);
      } break;
      default:
      {
        abort();
      } break;
    }
  }

  lddg.setinput(argv[argc - 1]);

  // Start the lddgraph processing
  if (lddg.run())
    exit(EXIT_SUCCESS);
  else
    exit(EXIT_FAILURE);
}